

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_vacuum.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::BindVacuumTable
          (Binder *this,LogicalVacuum *vacuum,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  TableCatalogEntry *table_p;
  pointer pCVar1;
  pointer pcVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  Binder *this_00;
  _Alloc_hider _Var4;
  LogicalVacuum *pLVar5;
  bool bVar6;
  type pVVar7;
  pointer pBVar8;
  pointer pBVar9;
  ColumnList *pCVar10;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var11;
  ColumnDefinition *pCVar12;
  BindContext *this_01;
  const_iterator cVar13;
  type ref;
  pointer this_02;
  LogicalGet *this_03;
  vector<duckdb::ColumnIndex,_true> *this_04;
  const_reference pvVar14;
  PhysicalIndex PVar15;
  mapped_type *pmVar16;
  idx_t table_index;
  LogicalProjection *this_05;
  pointer pLVar17;
  BinderException *pBVar18;
  InvalidInputException *this_06;
  _Hash_node_base *p_Var19;
  _Head_base<0UL,_duckdb::Expression_*,_false> __k;
  ClientContext *pCVar20;
  float fVar21;
  undefined4 uVar22;
  ColumnListIterator CVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  non_generated_column_names;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  select_list;
  ColumnRefExpression colref;
  case_insensitive_set_t column_name_set;
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  undefined1 auStack_240 [24];
  _Hash_node_base local_228 [2];
  _Alloc_hider local_218;
  char local_208 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1f8 [64];
  undefined8 local_1b8;
  _Prime_rehash_policy _Stack_1b0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_198;
  Binder *local_180;
  string local_178;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_158
  ;
  LogicalVacuum *local_150;
  __node_base_ptr local_148;
  ClientContext *local_140;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [48];
  undefined1 local_a8 [32];
  string local_88;
  undefined1 local_68 [56];
  
  pVVar7 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator*
                     (&vacuum->info);
  if (pVVar7->has_table == true) {
    local_158 = root;
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
              (&pVVar7->ref);
    Bind((Binder *)local_258,(TableRef *)this);
    pBVar8 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                         *)local_258);
    local_258._8_8_ = local_258._0_8_;
    if (pBVar8->type != BASE_TABLE) {
      this_06 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_248 = (undefined1  [8])((long)auStack_240 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"can only vacuum or analyze base tables","");
      InvalidInputException::InvalidInputException(this_06,(string *)local_248);
      __cxa_throw(this_06,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_258._0_8_ = (element_type *)0x0;
    local_180 = this;
    pBVar9 = unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                           *)(local_258 + 8));
    table_p = pBVar9->table;
    LogicalVacuum::SetTable(vacuum,table_p);
    local_198.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __k._M_head_impl =
         (Expression *)
         (pVVar7->columns).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pCVar20 = (ClientContext *)
              (pVVar7->columns).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_150 = vacuum;
    if ((ClientContext *)__k._M_head_impl == pCVar20) {
      pCVar10 = TableCatalogEntry::GetColumns(table_p);
      CVar23 = ColumnList::Physical(pCVar10);
      _Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)CVar23.list;
      if (((undefined1  [16])CVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pCVar1 = (pointer)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)_Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                 _M_head_impl + 8))->_M_pi;
        auStack_240._16_8_ =
             ((long)pCVar1 -
              *(long *)_Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3)
             * -0x7b425ed097b425ed;
        p_Var19 = (_Hash_node_base *)
                  (((long)pCVar1 -
                    *(long *)_Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                   >> 3) * -0x7b425ed097b425ed);
      }
      else {
        p_Var19 = (_Hash_node_base *)
                  (*(long *)((long)_Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                   _M_head_impl + 0x58) -
                   (long)(((vector<unsigned_long,_true> *)
                          ((long)_Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                 _M_head_impl + 0x50))->
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        auStack_240._16_8_ = p_Var19;
      }
      auStack_240._8_8_ = (_Hash_node_base *)0x0;
      auStack_240[0] = CVar23.physical;
      local_248 = (undefined1  [8])
                  _Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      while ((((_Hash_node_base *)auStack_240._8_8_ != p_Var19 ||
              ((_Hash_node_base *)auStack_240._16_8_ != p_Var19)) ||
             ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_248 !=
              _Var11.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl))) {
        pCVar12 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)local_248);
        ColumnDefinition::GetName_abi_cxx11_((string *)local_f8,pCVar12);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pVVar7->columns,(string *)local_f8);
        if ((__node_base_ptr)local_f8._0_8_ != (__node_base_ptr)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_);
        }
        auStack_240._8_8_ = auStack_240._8_8_ + 1;
      }
      __k._M_head_impl =
           (Expression *)
           (pVVar7->columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pCVar20 = (ClientContext *)
                (pVVar7->columns).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar22 = 0;
    fVar21 = 0.0;
    local_1b8._4_4_ = 0;
    local_1b8._0_4_ = 0;
    local_68._0_8_ = local_68 + 0x30;
    local_68._8_8_ = &DAT_00000001;
    local_68._16_8_ = (element_type *)0x0;
    local_68._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68._32_4_ = 1.0;
    local_68._40_8_ = (_Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>)0x0;
    local_68._48_8_ = (_Head_base<0UL,_duckdb::Logger_*,_false>)0x0;
    local_1b8 = 0;
    _Stack_1b0._M_max_load_factor = 0.0;
    _Stack_1b0._4_4_ = 0;
    _Stack_1b0._M_next_resize = 0;
    if ((ClientContext *)__k._M_head_impl == pCVar20) {
      _Stack_1b0._M_next_resize = 0;
    }
    else {
      this_01 = &local_180->bind_context;
      local_148 = (__node_base_ptr)&PTR__ColumnRefExpression_02439f20;
      local_140 = pCVar20;
      do {
        cVar13 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_68,(key_type *)__k._M_head_impl);
        if (cVar13.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
          local_248 = (undefined1  [8])((long)auStack_240 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,
                     "cannot vacuum or analyze the same column twice, i.e., there is a duplicate entry in the list of column names"
                     ,"");
          BinderException::BinderException(pBVar18,(string *)local_248);
          __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_248 = (undefined1  [8])local_68;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_68,__k._M_head_impl,(BindResult *)local_248);
        bVar6 = TableCatalogEntry::ColumnExists(table_p,(string *)__k._M_head_impl);
        if (!bVar6) {
          pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
          local_248 = (undefined1  [8])((long)auStack_240 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"Column with name \"%s\" does not exist","");
          local_a8._0_8_ = local_a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a8,*(long *)__k._M_head_impl,
                     (long)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)__k._M_head_impl + 8))->_M_pi->_vptr__Sp_counted_base +
                     *(long *)__k._M_head_impl);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar18,(string *)local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
          __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pCVar12 = TableCatalogEntry::GetColumn(table_p,(string *)__k._M_head_impl);
        bVar6 = ColumnDefinition::Generated(pCVar12);
        if (bVar6) {
          pBVar18 = (BinderException *)__cxa_allocate_exception(0x10);
          local_248 = (undefined1  [8])((long)auStack_240 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,
                     "cannot vacuum or analyze generated column \"%s\" - specify non-generated columns to vacuum or analyze"
                     ,"");
          ColumnDefinition::GetName_abi_cxx11_(&local_88,pCVar12);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar18,(string *)local_248,&local_88);
          __cxa_throw(pBVar18,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1b8,(value_type *)__k._M_head_impl);
        local_138._0_8_ = local_138 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,*(long *)__k._M_head_impl,
                   (long)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)__k._M_head_impl + 8))
                          ->_M_pi->_vptr__Sp_counted_base + *(long *)__k._M_head_impl);
        local_118._0_8_ = local_118 + 0x10;
        pcVar2 = (table_p->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar2,
                   pcVar2 + (table_p->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                            name._M_string_length);
        ColumnRefExpression::ColumnRefExpression
                  ((ColumnRefExpression *)local_f8,(string *)local_138,(string *)local_118);
        if ((_Hash_node_base *)local_118._0_8_ != (_Hash_node_base *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_);
        }
        if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
        BindContext::BindColumn((BindResult *)local_248,this_01,(ColumnRefExpression *)local_f8,0);
        if ((bool)auStack_240[0] == true) {
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,anon_var_dwarf_4ed193b + 9);
          ErrorData::Throw((ErrorData *)auStack_240,&local_178);
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_198,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_248);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_1f8);
        if (local_218._M_p != local_208) {
          operator_delete(local_218._M_p);
        }
        if ((_Hash_node_base *)auStack_240._8_8_ != local_228) {
          operator_delete((void *)auStack_240._8_8_);
        }
        if (local_248 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_248 + 8))();
        }
        local_f8._0_8_ = local_148;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_d8 + 0x18));
        local_f8._0_8_ = &PTR__BaseExpression_0243c368;
        if ((pointer)local_f8._16_8_ != (pointer)local_d8) {
          operator_delete((void *)local_f8._16_8_);
        }
        __k._M_head_impl = __k._M_head_impl + 0x20;
      } while ((ClientContext *)__k._M_head_impl != local_140);
      __k._M_head_impl =
           (Expression *)
           (pVVar7->columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pCVar20 = (ClientContext *)
                (pVVar7->columns).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      fVar21 = _Stack_1b0._M_max_load_factor;
      uVar22 = _Stack_1b0._4_4_;
    }
    auStack_240._8_8_ =
         (pVVar7->columns).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)
     &(pVVar7->columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (undefined4)local_1b8;
    *(undefined4 *)
     ((long)&(pVVar7->columns).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = local_1b8._4_4_;
    *(float *)&(pVVar7->columns).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish = fVar21;
    *(undefined4 *)
     ((long)&(pVVar7->columns).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar22;
    (pVVar7->columns).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Stack_1b0._M_next_resize;
    local_1b8 = 0;
    _Stack_1b0._M_max_load_factor = 0.0;
    _Stack_1b0._4_4_ = 0;
    _Stack_1b0._M_next_resize = 0;
    local_248 = (undefined1  [8])__k._M_head_impl;
    auStack_240._0_8_ = pCVar20;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
    ref = unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
          ::operator*((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                       *)(local_258 + 8));
    this_00 = local_180;
    CreatePlan(local_180,ref);
    this_02 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_f8);
    pLVar5 = local_150;
    this_03 = LogicalOperator::Cast<duckdb::LogicalGet>(this_02);
    this_04 = LogicalGet::GetColumnIds(this_03);
    local_248 = (undefined1  [8])0x0;
    if ((this_04->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this_04->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        pCVar10 = TableCatalogEntry::GetColumns(table_p);
        pvVar14 = vector<duckdb::ColumnIndex,_true>::operator[](this_04,(size_type)local_248);
        PVar15 = ColumnList::LogicalToPhysical(pCVar10,pvVar14->index);
        pmVar16 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pLVar5->column_id_map,(key_type *)local_248);
        *pmVar16 = PVar15.index;
        local_248 = (undefined1  [8])((long)local_248 + 1);
      } while ((ulong)local_248 <
               (ulong)((long)(this_04->
                             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                             ).
                             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_04->
                             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                             ).
                             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    table_index = GenerateTableIndex(this_00);
    this_05 = (LogicalProjection *)operator_new(0x70);
    local_248 = (undefined1  [8])
                local_198.
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    auStack_240._0_8_ =
         local_198.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_240._8_8_ =
         local_198.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_198.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogicalProjection::LogicalProjection
              (this_05,table_index,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_248);
    local_178._M_dataplus._M_p = (pointer)this_05;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_248);
    pLVar17 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_178);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar17->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_f8);
    _Var4._M_p = local_178._M_dataplus._M_p;
    local_178._M_dataplus._M_p = (pointer)0x0;
    _Var3._M_head_impl =
         (local_158->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_158->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)_Var4._M_p;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      if ((__buckets_ptr)local_178._M_dataplus._M_p != (__buckets_ptr)0x0) {
        (*(code *)(*(__node_base_ptr *)local_178._M_dataplus._M_p)[1]._M_nxt)();
      }
    }
    if ((__node_base_ptr)local_f8._0_8_ != (__node_base_ptr)0x0) {
      (*(code *)(*(_Hash_node_base **)local_f8._0_8_)[1]._M_nxt)();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_68);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_198);
    if ((element_type *)local_258._8_8_ != (element_type *)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(((((enable_shared_from_this<duckdb::Binder> *)local_258._8_8_)->
                          __weak_this_).internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi)();
    }
    if ((element_type *)local_258._0_8_ != (element_type *)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(((((enable_shared_from_this<duckdb::Binder> *)local_258._0_8_)->
                          __weak_this_).internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi)();
    }
  }
  return;
}

Assistant:

void Binder::BindVacuumTable(LogicalVacuum &vacuum, unique_ptr<LogicalOperator> &root) {
	auto &info = vacuum.GetInfo();
	if (!info.has_table) {
		return;
	}

	D_ASSERT(vacuum.column_id_map.empty());
	auto bound_table = Bind(*info.ref);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw InvalidInputException("can only vacuum or analyze base tables");
	}
	auto ref = unique_ptr_cast<BoundTableRef, BoundBaseTableRef>(std::move(bound_table));
	auto &table = ref->table;
	vacuum.SetTable(table);

	vector<unique_ptr<Expression>> select_list;
	auto &columns = info.columns;
	if (columns.empty()) {
		// Empty means ALL columns should be vacuumed/analyzed
		for (auto &col : table.GetColumns().Physical()) {
			columns.push_back(col.GetName());
		}
	}

	case_insensitive_set_t column_name_set;
	vector<string> non_generated_column_names;
	for (auto &col_name : columns) {
		if (column_name_set.count(col_name) > 0) {
			throw BinderException("cannot vacuum or analyze the same column twice, i.e., there is a duplicate entry in "
			                      "the list of column names");
		}
		column_name_set.insert(col_name);
		if (!table.ColumnExists(col_name)) {
			throw BinderException("Column with name \"%s\" does not exist", col_name);
		}
		auto &col = table.GetColumn(col_name);
		// ignore generated column
		if (col.Generated()) {
			throw BinderException(
			    "cannot vacuum or analyze generated column \"%s\" - specify non-generated columns to vacuum or analyze",
			    col.GetName());
		}
		non_generated_column_names.push_back(col_name);
		ColumnRefExpression colref(col_name, table.name);
		auto result = bind_context.BindColumn(colref, 0);
		if (result.HasError()) {
			result.error.Throw();
		}
		select_list.push_back(std::move(result.expression));
	}
	info.columns = std::move(non_generated_column_names);

	auto table_scan = CreatePlan(*ref);
	D_ASSERT(table_scan->type == LogicalOperatorType::LOGICAL_GET);

	auto &get = table_scan->Cast<LogicalGet>();

	auto &column_ids = get.GetColumnIds();
	D_ASSERT(select_list.size() == column_ids.size());
	D_ASSERT(info.columns.size() == column_ids.size());
	for (idx_t i = 0; i < column_ids.size(); i++) {
		vacuum.column_id_map[i] = table.GetColumns().LogicalToPhysical(column_ids[i].ToLogical()).index;
	}

	auto projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(select_list));
	projection->children.push_back(std::move(table_scan));

	root = std::move(projection);
}